

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

int ShLinkExt(ShHandle linkHandle,ShHandle *compHandles,int numHandles)

{
  pointer ppTVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  TPoolAllocator *poolAllocator;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  ulong uVar8;
  TShHandleBase *local_60;
  long *local_58;
  THandleList cObjects;
  
  if (numHandles != 0 && linkHandle != (ShHandle)0x0) {
    local_58 = (long *)linkHandle;
    glslang::TVector<TShHandleBase_*>::TVector(&cObjects);
    uVar8 = 0;
    uVar7 = (ulong)(uint)numHandles;
    if (numHandles < 1) {
      uVar7 = uVar8;
    }
    do {
      if (uVar7 == uVar8) {
        plVar6 = (long *)(**(code **)(*local_58 + 0x18))();
        if (plVar6 == (long *)0x0) {
          return 0;
        }
        poolAllocator = (TPoolAllocator *)(**(code **)(*plVar6 + 0x28))(plVar6);
        glslang::SetThreadPoolAllocator(poolAllocator);
        glslang::TInfoSinkBase::erase((TInfoSinkBase *)plVar6[2]);
        uVar8 = 0;
        do {
          if (uVar7 == uVar8) {
            bVar3 = (**(code **)(*plVar6 + 0x38))(plVar6,&cObjects);
            return (uint)bVar3;
          }
          iVar4 = (*cObjects.
                    super_vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>.
                    super__Vector_base<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar8]->_vptr_TShHandleBase[2])();
          if (CONCAT44(extraout_var,iVar4) != 0) {
            iVar4 = (*cObjects.
                      super_vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>.
                      super__Vector_base<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8]->_vptr_TShHandleBase[2])();
            cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x40))
                              ((long *)CONCAT44(extraout_var_00,iVar4));
            if (cVar2 == '\0') {
              glslang::TInfoSinkBase::message
                        ((TInfoSinkBase *)plVar6[2],EPrefixError,
                         "Not all shaders have valid object code.");
              return 0;
            }
          }
          uVar8 = uVar8 + 1;
        } while( true );
      }
      plVar6 = (long *)compHandles[uVar8];
      if (plVar6 == (long *)0x0) {
        return 0;
      }
      lVar5 = (**(code **)(*plVar6 + 0x18))(plVar6);
      if (lVar5 != 0) {
        local_60 = (TShHandleBase *)(**(code **)(*plVar6 + 0x18))(plVar6);
        std::vector<TShHandleBase*,glslang::pool_allocator<TShHandleBase*>>::
        emplace_back<TShHandleBase*>
                  ((vector<TShHandleBase*,glslang::pool_allocator<TShHandleBase*>> *)&cObjects,
                   &local_60);
      }
      lVar5 = (**(code **)(*plVar6 + 0x10))(plVar6);
      if (lVar5 != 0) {
        local_60 = (TShHandleBase *)(**(code **)(*plVar6 + 0x10))(plVar6);
        std::vector<TShHandleBase*,glslang::pool_allocator<TShHandleBase*>>::
        emplace_back<TShHandleBase*>
                  ((vector<TShHandleBase*,glslang::pool_allocator<TShHandleBase*>> *)&cObjects,
                   &local_60);
      }
      ppTVar1 = cObjects.super_vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>.
                super__Vector_base<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar8;
      uVar8 = uVar8 + 1;
    } while (*ppTVar1 != (TShHandleBase *)0x0);
  }
  return 0;
}

Assistant:

int ShLinkExt(
    const ShHandle linkHandle,
    const ShHandle compHandles[],
    const int numHandles)
{
    if (linkHandle == nullptr || numHandles == 0)
        return 0;

    THandleList cObjects;

    for (int i = 0; i < numHandles; ++i) {
        if (compHandles[i] == nullptr)
            return 0;
        TShHandleBase* base = reinterpret_cast<TShHandleBase*>(compHandles[i]);
        if (base->getAsLinker()) {
            cObjects.push_back(base->getAsLinker());
        }
        if (base->getAsCompiler())
            cObjects.push_back(base->getAsCompiler());

        if (cObjects[i] == nullptr)
            return 0;
    }

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(linkHandle);
    TLinker* linker = static_cast<TLinker*>(base->getAsLinker());

    if (linker == nullptr)
        return 0;
    
    SetThreadPoolAllocator(linker->getPool());
    linker->infoSink.info.erase();

    for (int i = 0; i < numHandles; ++i) {
        if (cObjects[i]->getAsCompiler()) {
            if (! cObjects[i]->getAsCompiler()->linkable()) {
                linker->infoSink.info.message(EPrefixError, "Not all shaders have valid object code.");
                return 0;
            }
        }
    }

    bool ret = linker->link(cObjects);

    return ret ? 1 : 0;
}